

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Result * __thiscall
Catch::clara::detail::Parser::validate(Result *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer pcVar2;
  pointer pAVar3;
  pointer pOVar4;
  pointer pAVar5;
  bool bVar6;
  
  pOVar4 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pOVar4 == pOVar1;
  if (!bVar6) {
    (*(pOVar4->super_ParserRefImpl<Catch::clara::detail::Opt>).
      super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pOVar4);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok) {
      do {
        pOVar4 = pOVar4 + 1;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_001846f8;
        pcVar2 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(__return_storage_ptr__->m_errorMessage).field_2) {
          operator_delete(pcVar2);
        }
        bVar6 = pOVar4 == pOVar1;
        if (bVar6) goto LAB_0013e1c4;
        (*(pOVar4->super_ParserRefImpl<Catch::clara::detail::Opt>).
          super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2]
        )(__return_storage_ptr__,pOVar4);
      } while ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok);
    }
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_0013e1c4:
  pAVar5 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pAVar5 == pAVar3;
  if (!bVar6) {
    (*(pAVar5->super_ParserRefImpl<Catch::clara::detail::Arg>).
      super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
              (__return_storage_ptr__,pAVar5);
    if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok) {
      do {
        pAVar5 = pAVar5 + 1;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_001846f8;
        pcVar2 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(__return_storage_ptr__->m_errorMessage).field_2) {
          operator_delete(pcVar2);
        }
        bVar6 = pAVar5 == pAVar3;
        if (bVar6) goto LAB_0013e22b;
        (*(pAVar5->super_ParserRefImpl<Catch::clara::detail::Arg>).
          super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2]
        )(__return_storage_ptr__,pAVar5);
      } while ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type == Ok);
    }
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_0013e22b:
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001846f8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }